

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O3

uint64_t bitset_set_list_withcard(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  ushort *puVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar4 = croaring_hardware_support();
  if ((uVar4 & 1) == 0) {
    if (length != 0) {
      lVar5 = 0;
      do {
        uVar2 = *(ushort *)((long)list + lVar5);
        uVar6 = words[uVar2 >> 6] | 1L << ((ulong)uVar2 & 0x3f);
        card = card + ((words[uVar2 >> 6] ^ uVar6) >> ((byte)uVar2 & 0x3f));
        words[uVar2 >> 6] = uVar6;
        lVar5 = lVar5 + 2;
      } while (length * 2 != lVar5);
    }
  }
  else if (length != 0) {
    puVar1 = list + length;
    do {
      uVar2 = *list >> 6;
      uVar6 = words[uVar2];
      uVar3 = (ulong)*list & 0x3f;
      words[uVar2] = uVar6 | 1L << uVar3;
      card = (card + 1) - (ulong)((uVar6 >> uVar3 & 1) != 0);
      list = list + 1;
    } while (puVar1 != list);
  }
  return card;
}

Assistant:

uint64_t bitset_set_list_withcard(uint64_t *words, uint64_t card,
                                  const uint16_t *list, uint64_t length) {
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        return _asm_bitset_set_list_withcard(words, card, list, length);
    } else {
        return _scalar_bitset_set_list_withcard(words, card, list, length);
    }
}